

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_init_internal
                    (ma_dr_mp3 *pMP3,ma_dr_mp3_read_proc onRead,ma_dr_mp3_seek_proc onSeek,
                    void *pUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint32 mVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ma_dr_mp3dec *in_RDI;
  ma_allocation_callbacks *in_R8;
  ma_allocation_callbacks *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  _func_void_ptr_size_t_void_ptr *local_48;
  _func_void_ptr_void_ptr_size_t_void_ptr *local_40;
  _func_void_void_ptr_void_ptr *local_38;
  ma_bool32 local_4;
  
  ma_dr_mp3dec_init(in_RDI);
  *(undefined8 *)(in_RDI[1].mdct_overlap[0] + 3) = in_RSI;
  *(undefined8 *)(in_RDI[1].mdct_overlap[0] + 5) = in_RDX;
  *(undefined8 *)(in_RDI[1].mdct_overlap[0] + 7) = in_RCX;
  ma_dr_mp3_copy_allocation_callbacks_or_defaults
            ((ma_allocation_callbacks *)&stack0xffffffffffffffb0,in_R8);
  *(void **)(in_RDI[1].mdct_overlap[0] + 9) = in_stack_ffffffffffffffb0;
  *(_func_void_ptr_size_t_void_ptr **)(in_RDI[1].mdct_overlap[0] + 0xb) = local_48;
  *(_func_void_ptr_void_ptr_size_t_void_ptr **)(in_RDI[1].mdct_overlap[0] + 0xd) = local_40;
  *(_func_void_void_ptr_void_ptr **)(in_RDI[1].mdct_overlap[0] + 0xf) = local_38;
  if ((*(long *)(in_RDI[1].mdct_overlap[0] + 0xf) == 0) ||
     ((*(long *)(in_RDI[1].mdct_overlap[0] + 0xb) == 0 &&
      (*(long *)(in_RDI[1].mdct_overlap[0] + 0xd) == 0)))) {
    local_4 = 0;
  }
  else {
    mVar1 = ma_dr_mp3_decode_next_frame((ma_dr_mp3 *)0x20393f);
    if (mVar1 == 0) {
      ma_dr_mp3__free_from_callbacks(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_4 = 0;
    }
    else {
      in_RDI[1].mdct_overlap[0][0] = in_RDI[1].mdct_overlap[0][0x11];
      in_RDI[1].mdct_overlap[0][1] = in_RDI[1].mdct_overlap[0][0x12];
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_mp3_init_internal(ma_dr_mp3* pMP3, ma_dr_mp3_read_proc onRead, ma_dr_mp3_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(onRead != NULL);
    ma_dr_mp3dec_init(&pMP3->decoder);
    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->pUserData = pUserData;
    pMP3->allocationCallbacks = ma_dr_mp3_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pMP3->allocationCallbacks.onFree == NULL || (pMP3->allocationCallbacks.onMalloc == NULL && pMP3->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    if (ma_dr_mp3_decode_next_frame(pMP3) == 0) {
        ma_dr_mp3__free_from_callbacks(pMP3->pData, &pMP3->allocationCallbacks);
        return MA_FALSE;
    }
    pMP3->channels   = pMP3->mp3FrameChannels;
    pMP3->sampleRate = pMP3->mp3FrameSampleRate;
    return MA_TRUE;
}